

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor * ggml_view_tensor(ggml_context *ctx,ggml_tensor *src)

{
  ggml_tensor *tensor;
  long lVar1;
  
  tensor = ggml_new_tensor_impl(ctx,src->type,4,src->ne,src,0);
  ggml_format_name(tensor,"%s (view)",src->name);
  lVar1 = 6;
  do {
    tensor->ne[lVar1 + -2] = src->ne[lVar1 + -2];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 10);
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_view_tensor(
        struct ggml_context * ctx,
        struct ggml_tensor  * src) {
    struct ggml_tensor * result = ggml_new_tensor_impl(ctx, src->type, GGML_MAX_DIMS, src->ne, src, 0);
    ggml_format_name(result, "%s (view)", src->name);

    for (int i = 0; i < GGML_MAX_DIMS; i++) {
        result->nb[i] = src->nb[i];
    }

    return result;
}